

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseReportItems
          (OptionParser *this,int nodeOrLink,Network *network,int nTokens,string *tokens)

{
  bool bVar1;
  int iVar2;
  string *s1;
  InputError *pIVar3;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  string local_f0 [32];
  long local_d0;
  Link *link;
  int i_1;
  Node *local_a0;
  Node *node;
  int i;
  allocator local_59;
  string local_58 [32];
  IndexOption local_38;
  int local_34;
  IndexOption option;
  int value;
  string *tokens_local;
  Network *pNStack_20;
  int nTokens_local;
  Network *network_local;
  OptionParser *pOStack_10;
  int nodeOrLink_local;
  OptionParser *this_local;
  
  local_34 = 2;
  local_38 = REPORT_NODES;
  if (nodeOrLink == 1) {
    local_38 = REPORT_LINKS;
  }
  _option = tokens;
  tokens_local._4_4_ = nTokens;
  pNStack_20 = network;
  network_local._4_4_ = nodeOrLink;
  pOStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"NONE",&local_59);
  bVar1 = Utilities::match(tokens + 0x20,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (bVar1) {
    local_34 = 0;
  }
  s1 = _option + 0x20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"ALL",(allocator *)((long)&node + 7));
  bVar1 = Utilities::match(s1,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&node + 7));
  if (bVar1) {
    local_34 = 1;
  }
  if (local_34 == 2) {
    if (network_local._4_4_ == 0) {
      for (node._0_4_ = 1; (int)node < tokens_local._4_4_; node._0_4_ = (int)node + 1) {
        local_a0 = Network::node(pNStack_20,_option + (long)(int)node * 0x20);
        if (local_a0 == (Node *)0x0) {
          link._7_1_ = 1;
          pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&i_1,(string *)(_option + (long)(int)node * 0x20));
          InputError::InputError(pIVar3,5,(string *)&i_1);
          link._7_1_ = 0;
          __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
        }
        (local_a0->super_Element).field_0x2c = 1;
      }
    }
    else {
      __to = extraout_RDX;
      for (link._0_4_ = 1; (int)link < tokens_local._4_4_; link._0_4_ = (int)link + 1) {
        iVar2 = Network::link(pNStack_20,(char *)(_option + (long)(int)link * 0x20),__to);
        local_d0 = CONCAT44(extraout_var,iVar2);
        if (local_d0 == 0) {
          pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_f0,(string *)(_option + (long)(int)link * 0x20));
          InputError::InputError(pIVar3,5,(string *)local_f0);
          __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
        }
        *(undefined1 *)(local_d0 + 0x2c) = 1;
        __to = extraout_RDX_00;
      }
    }
  }
  else {
    Options::setOption(&pNStack_20->options,local_38,local_34);
  }
  return;
}

Assistant:

void OptionParser::parseReportItems(int nodeOrLink, Network* network,
                                    int nTokens, string* tokens)
{
    // ... process NODES ALL/NONE & LINKS ALL/NONE options
    int value = Options::SOME;
    Options::IndexOption option = Options::REPORT_NODES;
    if ( nodeOrLink == Element::LINK ) option = Options::REPORT_LINKS;
    if ( Utilities::match(tokens[1], "NONE") ) value = Options::NONE;
    if ( Utilities::match(tokens[1], "ALL") )  value = Options::ALL;
    if ( value != Options::SOME )
    {
        network->options.setOption(option, value);
        return;
    }

    // ... process NODES  n1  n2  etc. option
    if ( nodeOrLink == Element::NODE )
    {
        for (int i = 1; i < nTokens; i++)
        {
            Node* node = network->node(tokens[i]);
            if ( node == nullptr )
            {
                throw InputError(InputError::UNDEFINED_OBJECT, tokens[i]);
            }
            node->rptFlag = true;
        }
    }

    // ... process LINKS l1  l2  etc. option
    else
    {
        for (int i = 1; i < nTokens; i++)
        {
            Link* link = network->link(tokens[i]);
            if ( link == nullptr )
            {
                throw InputError(InputError::UNDEFINED_OBJECT, tokens[i]);
            }
            link->rptFlag = true;
        }
    }
}